

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

void __thiscall t_js_generator::generate_service(t_js_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  size_type *psVar8;
  long *plVar9;
  t_service *ptVar10;
  _Alloc_hider _Var11;
  t_program *ptVar12;
  pointer pptVar13;
  pointer pptVar14;
  pointer pptVar15;
  string f_service_ts_name;
  string f_service_name;
  string local_c0;
  t_service *local_a0;
  string local_98;
  ofstream_with_content_based_conditional_update *local_78;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_a0 = tservice;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_98,this);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_98,
                              (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                     _M_dataplus._M_p);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar8;
    local_c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_50 = &local_40;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_40 = *plVar9;
    lStack_38 = plVar5[3];
  }
  else {
    local_40 = *plVar9;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_c0,(char *)local_50,(allocator *)&local_98);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_service_).super_ostringstream.
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  local_78 = &this->f_service_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (local_78);
  (this->f_service_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
  field_0x90 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (this->gen_episode_file_ == true) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_episode_,
                        (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus.
                        _M_p,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->thrift_package_output_directory_)._M_dataplus._M_p,
                        (this->thrift_package_output_directory_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.service_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.service_name_.
                        _M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (this->gen_ts_ == true) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_70,this);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,
                                (ulong)(this->super_t_oop_generator).super_t_generator.service_name_
                                       ._M_dataplus._M_p);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar5[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_98._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = puVar7[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_c0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    std::__cxx11::string::string
              ((string *)&local_98,local_c0._M_dataplus._M_p,(allocator *)&local_70);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_service_ts_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(&this->f_service_ts_);
    (this->f_service_ts_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
    field_0x90 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_c0,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_78,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (((this->gen_node_ != false) || (this->gen_es6_ == true)) && (this->no_ns_ == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_78,"\"use strict\";",0xd);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_78,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  js_includes_abi_cxx11_(&local_c0,this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_78,local_c0._M_dataplus._M_p,local_c0._M_string_length);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  render_includes_abi_cxx11_(&local_98,this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (this->gen_ts_ == true) {
    if (local_a0->extends_ != (t_service *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->f_service_ts_,"/// <reference path=\"",0x15);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->f_service_ts_,*(char **)CONCAT44(extraout_var,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".d.ts\" />",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_c0,this);
    poVar1 = &this->f_service_ts_;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    ts_includes_abi_cxx11_(&local_98,this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    render_ts_includes_abi_cxx11_(&local_70,this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (this->gen_node_ == true) {
      std::operator+(&local_98,"import ttypes = require(\'./",
                     &((this->super_t_oop_generator).super_t_generator.program_)->name_);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      psVar8 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_c0._M_string_length = puVar7[1];
      *puVar7 = psVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_c0._M_dataplus._M_p,local_c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
      pptVar13 = (ptVar12->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pptVar13 !=
          (ptVar12->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"import ",7);
          iVar4 = (*((*pptVar13)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,*(char **)CONCAT44(extraout_var_00,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ttypes.",10);
          js_namespace_abi_cxx11_
                    (&local_c0,this,(this->super_t_oop_generator).super_t_generator.program_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          iVar4 = (*((*pptVar13)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)CONCAT44(extraout_var_01,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var_01,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          pptVar13 = pptVar13 + 1;
        } while (pptVar13 !=
                 (ptVar12->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
      }
      pptVar14 = (ptVar12->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (pptVar14 !=
          (ptVar12->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"import ",7);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          pcVar3 = ((*pptVar14)->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,pcVar3,pcVar3 + ((*pptVar14)->name_)._M_string_length);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,local_c0._M_dataplus._M_p,local_c0._M_string_length)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ttypes.",10);
          js_namespace_abi_cxx11_
                    (&local_98,this,(this->super_t_oop_generator).super_t_generator.program_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_98._M_dataplus._M_p,local_98._M_string_length);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar3 = ((*pptVar14)->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + ((*pptVar14)->name_)._M_string_length);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          pptVar14 = pptVar14 + 1;
        } while (pptVar14 !=
                 (ptVar12->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
      }
      pptVar15 = (ptVar12->xceptions_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (pptVar15 !=
          (ptVar12->xceptions_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"import ",7);
          iVar4 = (*((*pptVar15)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,*(char **)CONCAT44(extraout_var_02,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var_02,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ttypes.",10);
          js_namespace_abi_cxx11_
                    (&local_c0,this,(this->super_t_oop_generator).super_t_generator.program_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          iVar4 = (*((*pptVar15)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)CONCAT44(extraout_var_03,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var_03,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          pptVar15 = pptVar15 + 1;
        } while (pptVar15 !=
                 (ptVar12->xceptions_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
      }
      pptVar15 = (ptVar12->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (pptVar15 !=
          (ptVar12->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"import ",7);
          iVar4 = (*((*pptVar15)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,*(char **)CONCAT44(extraout_var_04,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var_04,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ttypes.",10);
          js_namespace_abi_cxx11_
                    (&local_c0,this,(this->super_t_oop_generator).super_t_generator.program_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          iVar4 = (*((*pptVar15)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)CONCAT44(extraout_var_05,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var_05,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          pptVar15 = pptVar15 + 1;
        } while (pptVar15 !=
                 (ptVar12->structs_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"import { ",9);
      ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(ptVar12->name_)._M_dataplus._M_p,
                          (ptVar12->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," } from \"./",0xb);
      ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(ptVar12->name_)._M_dataplus._M_p,(ptVar12->name_)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types\";",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((this->ts_module_)._M_string_length != 0) {
      if (this->gen_node_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"declare module ",0xf);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,(this->ts_module_)._M_dataplus._M_p,
                            (this->ts_module_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"declare module \"./",0x12);
        ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,(ptVar12->name_)._M_dataplus._M_p,
                            (ptVar12->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_types\" {",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
        ts_indent_abi_cxx11_(&local_c0,this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)poVar1,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"module ",7);
        ptVar12 = (this->super_t_oop_generator).super_t_generator.program_;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(ptVar12->name_)._M_dataplus._M_p,
                            (ptVar12->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + 1;
      }
    }
  }
  if (this->gen_node_ == true) {
    if (local_a0->extends_ != (t_service *)0x0) {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_78,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_06,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_06,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = require(\'./",0xe);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_07,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_07,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\');",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_08,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_08,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Client = ",9);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_09,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_09,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".Client;",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_10,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_10,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Processor = ",0xc);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_11,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_11,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".Processor;",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->f_service_ts_,"import ",7);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->f_service_ts_,*(char **)CONCAT44(extraout_var_12,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_12,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = require(\'./",0xe);
      iVar4 = (*(local_a0->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)CONCAT44(extraout_var_13,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var_13,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\');",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_78,(this->js_const_type_)._M_dataplus._M_p,
                        (this->js_const_type_)._M_string_length);
    std::operator+(&local_98,"ttypes = require(\'./",
                   &((this->super_t_oop_generator).super_t_generator.program_)->name_);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    psVar8 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = puVar7[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_c0._M_string_length = puVar7[1];
    *puVar7 = psVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  generate_service_helpers(this,local_a0);
  ptVar10 = local_a0;
  generate_service_client(this,local_a0);
  iVar4 = (int)ptVar10;
  if (this->gen_node_ == true) {
    ptVar10 = local_a0;
    generate_service_processor(this,local_a0);
    iVar4 = (int)ptVar10;
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (local_78,iVar4);
  if (this->gen_ts_ == true) {
    if ((this->ts_module_)._M_string_length != 0) {
      if (this->gen_node_ == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_service_ts_,"}",1);
      }
      else {
        piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar2 = *piVar2 + -1;
        ts_indent_abi_cxx11_(&local_c0,this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&this->f_service_ts_,local_c0._M_dataplus._M_p,
                            local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_service_ts_,"}",1);
      }
      _Var11._M_p = ::endl_abi_cxx11_._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->f_service_ts_,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      iVar4 = (int)_Var11._M_p;
    }
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_service_ts_,iVar4);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void t_js_generator::generate_service(t_service* tservice) {
  string f_service_name = get_out_dir() + service_name_ + ".js";
  f_service_.open(f_service_name.c_str());
  if (gen_episode_file_) {
    f_episode_ << service_name_ << ":" << thrift_package_output_directory_ << "/" << service_name_ << endl;
  }

  if (gen_ts_) {
    string f_service_ts_name = get_out_dir() + service_name_ + ".d.ts";
    f_service_ts_.open(f_service_ts_name.c_str());
  }

  f_service_ << autogen_comment();

  if ((gen_node_ || gen_es6_) && no_ns_) {
    f_service_ << "\"use strict\";" << endl << endl;
  }

  f_service_ << js_includes() << endl << render_includes() << endl;

  if (gen_ts_) {
    if (tservice->get_extends() != nullptr) {
      f_service_ts_ << "/// <reference path=\"" << tservice->get_extends()->get_name()
                    << ".d.ts\" />" << endl;
    }
    f_service_ts_ << autogen_comment() << endl << ts_includes() << endl << render_ts_includes() << endl;
    if (gen_node_) {
      f_service_ts_ << "import ttypes = require('./" + program_->get_name() + "_types');" << endl;
      // Generate type aliases
      // enum
      vector<t_enum*> const& enums = program_->get_enums();
      vector<t_enum*>::const_iterator e_iter;
      for (e_iter = enums.begin(); e_iter != enums.end(); ++e_iter) {
        f_service_ts_ << "import " << (*e_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*e_iter)->get_name() << endl;
      }
      // const
      vector<t_const*> const& consts = program_->get_consts();
      vector<t_const*>::const_iterator c_iter;
      for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
        f_service_ts_ << "import " << (*c_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*c_iter)->get_name() << endl;
      }
      // exception
      vector<t_struct*> const& exceptions = program_->get_xceptions();
      vector<t_struct*>::const_iterator x_iter;
      for (x_iter = exceptions.begin(); x_iter != exceptions.end(); ++x_iter) {
        f_service_ts_ << "import " << (*x_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*x_iter)->get_name() << endl;
      }
      // structs
      vector<t_struct*> const& structs = program_->get_structs();
      vector<t_struct*>::const_iterator s_iter;
      for (s_iter = structs.begin(); s_iter != structs.end(); ++s_iter) {
        f_service_ts_ << "import " << (*s_iter)->get_name() << " = ttypes."
                  << js_namespace(program_) << (*s_iter)->get_name() << endl;
      }
    } else {
      f_service_ts_ << "import { " << program_->get_name() << " } from \"./" << program_->get_name() << "_types\";" << endl << endl;
    }
    if (!ts_module_.empty()) {
      if (gen_node_) {
        f_service_ts_ << "declare module " << ts_module_ << " {";
      } else {
        f_service_ts_ << "declare module \"./" << program_->get_name() << "_types\" {" << endl;
        indent_up();
        f_service_ts_ << ts_indent() << "module " << program_->get_name() << " {" << endl;
        indent_up();
      }
    }
  }

  if (gen_node_) {
    if (tservice->get_extends() != nullptr) {
      f_service_ << js_const_type_ <<  tservice->get_extends()->get_name() << " = require('./"
                 << tservice->get_extends()->get_name() << "');" << endl << js_const_type_
                 << tservice->get_extends()->get_name()
                 << "Client = " << tservice->get_extends()->get_name() << ".Client;" << endl
                 << js_const_type_ << tservice->get_extends()->get_name()
                 << "Processor = " << tservice->get_extends()->get_name() << ".Processor;" << endl;

      f_service_ts_ << "import " << tservice->get_extends()->get_name() << " = require('./"
                    << tservice->get_extends()->get_name() << "');" << endl;
    }

    f_service_ << js_const_type_ << "ttypes = require('./" + program_->get_name() + "_types');" << endl;
  }

  generate_service_helpers(tservice);
  generate_service_interface(tservice);
  generate_service_client(tservice);

  if (gen_node_) {
    generate_service_processor(tservice);
  }

  f_service_.close();
  if (gen_ts_) {
    if (!ts_module_.empty()) {
      if (gen_node_) {
        f_service_ts_ << "}" << endl;
      } else {
        indent_down();
        f_service_ts_ << ts_indent() << "}" << endl;
        f_service_ts_ << "}" << endl;
      }
    }
    f_service_ts_.close();
  }
}